

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall
helics::Federate::requestTimeIterativeAsync
          (Federate *this,Time nextInternalTimeStep,IterationRequest iterate)

{
  baseType bVar1;
  bool bVar2;
  pointer p_Var3;
  _Result<helics::iteration_time> *p_Var4;
  InvalidFunctionCall *this_00;
  char *pcVar5;
  _State_baseV2 *__tmp;
  string_view message;
  size_t sStack_d0;
  Modes exp;
  __allocator_type __a2;
  __state_type local_b8;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_a8;
  __allocator_type __a2_1;
  thread local_80;
  undefined4 local_77;
  undefined3 uStack_73;
  baseType local_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  __basic_future<helics::iteration_time> local_58;
  handle asyncInfo;
  
  if (this->singleThreadFederate == true) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar5 = "Async function calls and methods are not allowed for single thread federates";
    sStack_d0 = 0x4c;
  }
  else {
    exp = EXECUTING;
    bVar2 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                      (&this->currentMode,&exp,PENDING_ITERATIVE_TIME,seq_cst);
    if (bVar2) {
      preTimeRequestOperations(this,nextInternalTimeStep,iterate != NO_ITERATIONS);
      gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
                (&asyncInfo,
                 (this->asyncCallInfo)._M_t.
                 super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 .
                 super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
                 ._M_head_impl);
      local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (pointer)operator_new(0x60);
      (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_004865a8;
      *(undefined8 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var3->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x18) = 0;
      local_a8._M_alloc = &__a2;
      *(undefined8 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var3->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_004865f8;
      local_a8._M_ptr = p_Var3;
      p_Var4 = (_Result<helics::iteration_time> *)operator_new(0x28);
      std::__future_base::_Result<helics::iteration_time>::_Result(p_Var4);
      *(_Result<helics::iteration_time> **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x30) =
           p_Var4;
      *(Federate **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x38) = this;
      *(baseType *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x40) =
           nextInternalTimeStep.internalTimeCode;
      (p_Var3->_M_impl)._M_storage._M_storage.__data[0x48] = iterate;
      local_80._M_id._M_thread = (id)0;
      ___a2_1 = (long *)operator_new(0x20);
      *___a2_1 = (long)&PTR___State_00486650;
      ___a2_1[1] = (long)&p_Var3->_M_impl;
      ___a2_1[2] = (long)std::__future_base::
                         _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1042:44)>_>,_helics::iteration_time>
                         ::_M_run;
      ___a2_1[3] = 0;
      std::thread::_M_start_thread(&local_80,&__a2_1,0);
      local_70 = nextInternalTimeStep.internalTimeCode;
      if (___a2_1 != (long *)0x0) {
        (**(code **)(*___a2_1 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x20),&local_80);
      std::thread::~thread(&local_80);
      local_a8._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1042:44)>_>,_helics::iteration_time>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1042:44)>_>,_helics::iteration_time>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_a8);
      local_68 = 0;
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a8._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_b8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_a8._M_ptr =
           (pointer)local_b8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var3->_M_impl;
      local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_ptr);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
      if (local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        p_Var3 = (pointer)operator_new(0x50);
        local_a8._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)&__a2_1;
        (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00486690;
        *(undefined8 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var3->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var3->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_004866e0;
        local_a8._M_ptr = p_Var3;
        p_Var4 = (_Result<helics::iteration_time> *)operator_new(0x28);
        bVar1 = local_70;
        std::__future_base::_Result<helics::iteration_time>::_Result(p_Var4);
        *(_Result<helics::iteration_time> **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x20)
             = p_Var4;
        *(Federate **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x28) = this;
        *(baseType *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x30) = bVar1;
        (p_Var3->_M_impl)._M_storage._M_storage.__data[0x38] = iterate;
        *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x39) = local_77;
        *(uint *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x3c) =
             CONCAT31(uStack_73,local_77._3_1_);
        local_a8._M_ptr = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1042:44)>_>,_helics::iteration_time>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1042:44)>_>,_helics::iteration_time>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_a8);
        local_68 = 0;
        _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a8._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1042:44)>_>,_helics::iteration_time>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)local_b8.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
        local_a8._M_ptr =
             (pointer)local_b8.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&p_Var3->_M_impl;
        local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_ptr);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
      }
      std::__basic_future<helics::iteration_time>::__basic_future(&local_58,&local_b8);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b8.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::future<helics::iteration_time>::operator=
                (&(asyncInfo.data)->timeRequestIterativeFuture,
                 (future<helics::iteration_time> *)&local_58);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::unique_lock<std::mutex>::~unique_lock(&asyncInfo.m_handle_lock);
      return;
    }
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar5 = "cannot call request time in present state";
    sStack_d0 = 0x29;
  }
  message._M_str = pcVar5;
  message._M_len = sStack_d0;
  InvalidFunctionCall::InvalidFunctionCall(this_00,message);
  __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void Federate::requestTimeIterativeAsync(Time nextInternalTimeStep, IterationRequest iterate)
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    auto exp = Modes::EXECUTING;
    if (currentMode.compare_exchange_strong(exp, Modes::PENDING_ITERATIVE_TIME)) {
        preTimeRequestOperations(nextInternalTimeStep, iterate != IterationRequest::NO_ITERATIONS);
        auto asyncInfo = asyncCallInfo->lock();
        asyncInfo->timeRequestIterativeFuture =
            std::async(std::launch::async, [this, nextInternalTimeStep, iterate]() {
                return coreObject->requestTimeIterative(fedID, nextInternalTimeStep, iterate);
            });
    } else {
        throw(InvalidFunctionCall("cannot call request time in present state"));
    }
}